

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O2

void Qentem::Test::TestIfUTag2(QTest *test)

{
  Value<char16_t> *this;
  StringStream<char16_t> *pSVar1;
  StringStream<char16_t> ss;
  Value<char16_t> value;
  StringStream<char16_t> local_48;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_38;
  undefined1 local_28;
  
  local_48.storage_ = (char16_t *)0x0;
  local_48.length_ = 0;
  local_48.capacity_ = 0;
  local_38.array_.storage_ = (Value<char16_t> *)0x0;
  local_38._8_8_ = 0;
  local_28 = 0;
  this = Value<char16_t>::operator[]((Value<char16_t> *)&local_38.array_,L"name");
  Value<char16_t>::operator=(this,L"Qentem");
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if case=\"1\">{var:name}",(Value<char16_t> *)&local_38.array_,&local_48);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[24]>
            (test,pSVar1,(char16_t (*) [24])L"<if case=\"1\">{var:name}",0xdb6);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if<if case=\"1\">{var:name}</if>",(Value<char16_t> *)&local_38.array_,
                      &local_48);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[32]>
            (test,pSVar1,(char16_t (*) [32])L"<if<if case=\"1\">{var:name}</if>",0xdba);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if case=\"1\"><if case=\"1\">{var:name}</if>",
                      (Value<char16_t> *)&local_38.array_,&local_48);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[42]>
            (test,pSVar1,(char16_t (*) [42])L"<if case=\"1\"><if case=\"1\">{var:name}</if>",0xdbe);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if case=\"1\"><if case=\"1\"><if case=\"1\">{var:name}</if></if>",
                      (Value<char16_t> *)&local_38.array_,&local_48);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[60]>
            (test,pSVar1,
             (char16_t (*) [60])L"<if case=\"1\"><if case=\"1\"><if case=\"1\">{var:name}</if></if>"
             ,0xdc3);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if case=\"ABC\">{var:name}</if>",(Value<char16_t> *)&local_38.array_,
                      &local_48);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[1]>
            (test,pSVar1,(char16_t (*) [1])0x125a92,0xdc7);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if>{var:name}</if>",(Value<char16_t> *)&local_38.array_,&local_48);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[1]>
            (test,pSVar1,(char16_t (*) [1])0x125a92,0xdcb);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if case=\"0\"><elseif />{var:name}</if>",
                      (Value<char16_t> *)&local_38.array_,&local_48);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[39]>
            (test,pSVar1,(char16_t (*) [39])L"<if case=\"0\"><elseif />{var:name}</if>",0xdcf);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<iw case=\"0\">{var:name}</if>",(Value<char16_t> *)&local_38.array_,
                      &local_48);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[25]>
            (test,pSVar1,(char16_t (*) [25])L"<iw case=\"0\">Qentem</if>",0xdd3);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if case=\"0\"{var:name}</if>",(Value<char16_t> *)&local_38.array_,&local_48
                     );
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[28]>
            (test,pSVar1,(char16_t (*) [28])L"<if case=\"0\"{var:name}</if>",0xdd7);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<if case=\"0\"><else {var:name}</if>",(Value<char16_t> *)&local_38.array_,
                      &local_48);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[35]>
            (test,pSVar1,(char16_t (*) [35])L"<if case=\"0\"><else {var:name}</if>",0xddb);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char16_t>::~Value((Value<char16_t> *)&local_38.array_);
  Memory::Deallocate(local_48.storage_);
  return;
}

Assistant:

static void TestIfUTag2(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value;
    const char16_t        *content;

    value[uR"(name)"] = uR"(Qentem)";

    content = uR"(<if case="1">{var:name})";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if case="1">{var:name})", __LINE__);
    ss.Clear();

    content = uR"(<if<if case="1">{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if<if case="1">{var:name}</if>)", __LINE__);
    ss.Clear();

    content = uR"(<if case="1"><if case="1">{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if case="1"><if case="1">{var:name}</if>)", __LINE__);
    ss.Clear();

    content = uR"(<if case="1"><if case="1"><if case="1">{var:name}</if></if>)";
    test.IsEqual(Template::Render(content, value, ss),
                 uR"(<if case="1"><if case="1"><if case="1">{var:name}</if></if>)", __LINE__);
    ss.Clear();

    content = uR"(<if case="ABC">{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"()", __LINE__);
    ss.Clear();

    content = uR"(<if>{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"()", __LINE__);
    ss.Clear();

    content = uR"(<if case="0"><elseif />{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if case="0"><elseif />{var:name}</if>)", __LINE__);
    ss.Clear();

    content = uR"(<iw case="0">{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<iw case="0">Qentem</if>)", __LINE__);
    ss.Clear();

    content = uR"(<if case="0"{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if case="0"{var:name}</if>)", __LINE__);
    ss.Clear();

    content = uR"(<if case="0"><else {var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if case="0"><else {var:name}</if>)", __LINE__);
    ss.Clear();
}